

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  int iVar2;
  ulong uVar3;
  SQObjectValue SVar4;
  char *pcVar5;
  ulong uVar6;
  _HashNode *p_Var7;
  SQObjectValue *pSVar8;
  SQObjectPtr t;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._type = OT_NULL;
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  uVar3 = (ulong)len >> 5 | 1;
  pcVar5 = s;
  uVar6 = len;
  if (uVar3 <= (ulong)len) {
    do {
      len = len ^ (ulong)(ushort)(short)*pcVar5 + ((ulong)len >> 2) + len * 0x20;
      uVar6 = uVar6 - uVar3;
      pcVar5 = pcVar5 + 1;
    } while (uVar3 <= uVar6);
  }
  p_Var7 = this->_keywords->_nodes + (this->_keywords->_numofnodes - 1U & len);
  while (((p_Var7->key).super_SQObject._type != OT_STRING ||
         (iVar2 = strcmp((char *)&((p_Var7->key).super_SQObject._unVal.pOuter)->_idx,s), iVar2 != 0)
         )) {
    p_Var7 = p_Var7->next;
    if (p_Var7 == (_HashNode *)0x0) {
      SVar4.nInteger = 0x102;
LAB_001242da:
      SQObjectPtr::~SQObjectPtr(&local_20);
      return (SQInteger)SVar4.pTable;
    }
  }
  local_20.super_SQObject._type = (p_Var7->val).super_SQObject._type;
  pSVar8 = &(p_Var7->val).super_SQObject._unVal;
  if (local_20.super_SQObject._type == OT_WEAKREF) {
    local_20.super_SQObject._type = *(SQObjectType *)&pSVar8->pString->_sharedstate;
    pSVar8 = (SQObjectValue *)&pSVar8->pString->_next;
  }
  SVar4.pWeakRef = (SQWeakRef *)pSVar8->pTable;
  local_20.super_SQObject._unVal.pWeakRef = SVar4.pWeakRef;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  goto LAB_001242da;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}